

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

Var Js::JavascriptNumber::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptNumberObject *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *constructor;
  RecyclableObject *obj_00;
  double dVar7;
  JavascriptNumberObject *local_90;
  JavascriptNumberObject *obj;
  Var result;
  byte local_51;
  Var pvStack_50;
  bool isCtorSuperCall;
  Var newTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x16f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  newTarget = RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x176,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvStack_50 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&result,(Arguments *)&scriptContext);
  local_51 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&result);
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    obj = (JavascriptNumberObject *)TaggedInt::ToVarUnchecked(0);
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = TaggedInt::Is(pvVar6);
    if (!bVar2) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      bVar2 = Is(pvVar6);
      if (!bVar2) {
        pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
        bVar2 = VarIs<Js::JavascriptNumberObject>(pvVar6);
        if (bVar2) {
          pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
          this_00 = VarTo<Js::JavascriptNumberObject>(pvVar6);
          dVar7 = JavascriptNumberObject::GetValue(this_00);
          obj = (JavascriptNumberObject *)ToVarNoCheck(dVar7,(ScriptContext *)newTarget);
        }
        else {
          pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
          dVar7 = JavascriptConversion::ToNumber(pvVar6,(ScriptContext *)newTarget);
          obj = (JavascriptNumberObject *)ToVarNoCheck(dVar7,(ScriptContext *)newTarget);
        }
        goto LAB_012ca146;
      }
    }
    obj = (JavascriptNumberObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
LAB_012ca146:
  CVar3 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_New);
  if (CVar3 != CallFlags_None) {
    this_01 = ScriptContext::GetLibrary((ScriptContext *)newTarget);
    obj = JavascriptLibrary::CreateNumberObject(this_01,obj);
  }
  if ((local_51 & 1) == 0) {
    local_90 = obj;
  }
  else {
    constructor = VarTo<Js::RecyclableObject>(pvStack_50);
    obj_00 = VarTo<Js::RecyclableObject>(obj);
    local_90 = (JavascriptNumberObject *)
               Js::JavascriptOperators::OrdinaryCreateFromConstructor
                         (constructor,obj_00,(DynamicObject *)0x0,(ScriptContext *)newTarget);
  }
  return local_90;
}

Assistant:

Var JavascriptNumber::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        //
        // Determine if called as a constructor or a function.
        //

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        Var result;

        if (args.Info.Count > 1)
        {
            if (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1]))
            {
                result = args[1];
            }
            else if (VarIs<JavascriptNumberObject>(args[1]))
            {
                result = JavascriptNumber::ToVarNoCheck(VarTo<JavascriptNumberObject>(args[1])->GetValue(), scriptContext);
            }
            else
            {
                result = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(args[1], scriptContext), scriptContext);
            }
        }
        else
        {
            result = TaggedInt::ToVarUnchecked(0);
        }

        if (callInfo.Flags & CallFlags_New)
        {
            JavascriptNumberObject* obj = scriptContext->GetLibrary()->CreateNumberObject(result);
            result = obj;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), VarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }